

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O1

unsigned_long kwssys::Directory::GetNumberOfFilesInDirectory(string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *pcVar3;
  unsigned_long uVar4;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar2 = readdir(__dirp);
    uVar4 = 0;
    while (pdVar2 != (dirent *)0x0) {
      uVar4 = uVar4 + 1;
      pdVar2 = readdir(__dirp);
    }
    if (*piVar1 == 0) {
      closedir(__dirp);
      return uVar4;
    }
  }
  if (errorMessage != (string *)0x0) {
    pcVar3 = strerror(*piVar1);
    std::__cxx11::string::string((string *)local_40,pcVar3,&local_41);
    std::__cxx11::string::operator=((string *)errorMessage,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return 0;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name,
                                                     std::string* errorMessage)
{
  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return false;
  }

  closedir(dir);
  return count;
}